

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

_Bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev,ggml_backend_buffer_type_t buft)

{
  byte bVar1;
  undefined8 in_RSI;
  undefined1 local_11;
  
  bVar1 = ggml_backend_buft_is_host(in_RSI);
  local_11 = true;
  if ((bVar1 & 1) == 0) {
    local_11 = ggml_backend_cpu_is_extra_buffer_type(buft);
  }
  return local_11;
}

Assistant:

static bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev, ggml_backend_buffer_type_t buft) {
    return ggml_backend_buft_is_host(buft) || ggml_backend_cpu_is_extra_buffer_type(buft);
    GGML_UNUSED(dev);
}